

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O1

bool __thiscall HighsSearch::orbitsValidInChildNode(HighsSearch *this,HighsDomainChange *branchChg)

{
  double dVar1;
  int iVar2;
  StabilizerOrbits *this_00;
  HighsLp *pHVar3;
  bool bVar4;
  bool bVar5;
  
  this_00 = (this->nodestack).
            super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1].stabilizerOrbits.
            super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bVar5 = true;
  if (((this_00 != (StabilizerOrbits *)0x0) &&
      ((this_00->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this_00->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish)) &&
     (bVar4 = StabilizerOrbits::isStabilized(this_00,branchChg->column), !bVar4)) {
    if (branchChg->boundtype == kUpper) {
      iVar2 = branchChg->column;
      pHVar3 = ((this->localdom).mipsolver)->model_;
      if ((((pHVar3->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar2] != kContinuous) &&
          (dVar1 = (pHVar3->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2], dVar1 == 0.0)) &&
         ((!NAN(dVar1) &&
          ((dVar1 = (pHVar3->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start[iVar2], dVar1 == 1.0 && (!NAN(dVar1))))))) {
        return true;
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool HighsSearch::orbitsValidInChildNode(
    const HighsDomainChange& branchChg) const {
  HighsInt branchCol = branchChg.column;
  // if the variable is integral or we are in an up branch the stabilizer only
  // stays valid if the column has been stabilized
  const NodeData& currNode = nodestack.back();
  if (!currNode.stabilizerOrbits ||
      currNode.stabilizerOrbits->orbitCols.empty() ||
      currNode.stabilizerOrbits->isStabilized(branchCol))
    return true;

  // a down branch stays valid if the variable is binary
  if (branchChg.boundtype == HighsBoundType::kUpper &&
      localdom.isGlobalBinary(branchChg.column))
    return true;

  return false;
}